

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::name2dataaddress(Forth *this)

{
  bool bVar1;
  char cVar2;
  __type_conflict _Var3;
  size_type sVar4;
  reference pcVar5;
  reference plVar6;
  int in_ESI;
  ForthStack<unsigned_int> *this_00;
  undefined1 local_78 [8];
  reverse_iterator itEnd;
  reverse_iterator it;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  undefined1 local_38 [8];
  string localName;
  uint address;
  uint u;
  Forth *this_local;
  
  bl(this);
  word(this);
  sVar4 = std::
          vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
          size(&this->localVariables);
  if (sVar4 != 0) {
    dup(this,in_ESI);
    count(this);
    this_00 = &this->dStack;
    localName.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    localName.field_2._8_4_ = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    std::__cxx11::string::string((string *)local_38);
    moveFromDataSpace(this,(string *)local_38,localName.field_2._8_4_,
                      (ulong)(uint)localName.field_2._12_4_);
    __end3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38);
    while (bVar1 = __gnu_cxx::
                   operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3);
      cVar2 = toupper_ascii(*pcVar5);
      *pcVar5 = cVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
    rbegin((vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
            *)&itEnd);
    std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
    rend((vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_> *)
         local_78);
    while (bVar1 = std::
                   operator==<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>_>
                             (&itEnd,(reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>_>
                                      *)local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
      plVar6 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>_>
               ::operator*(&itEnd);
      _Var3 = std::operator==(&plVar6->localName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38);
      if (_Var3) {
        plVar6 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>_>
                 ::operator*(&itEnd);
        ForthStack<unsigned_int>::setTop(&this->dStack,plVar6->localAddress);
        bVar1 = true;
        goto LAB_00122c59;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>_>
      ::operator++(&itEnd);
    }
    bVar1 = false;
LAB_00122c59:
    std::__cxx11::string::~string((string *)local_38);
    if (bVar1) {
      return;
    }
  }
  find(this);
  drop(this);
  toBody(this);
  return;
}

Assistant:

void name2dataaddress(){
			bl();word();
			if(localVariables.size()>0){
				dup();
				count();
				auto u=dStack.getTop(); dStack.pop();
				auto address=dStack.getTop(); dStack.pop();
				std::string localName{};
				moveFromDataSpace(localName,address,u);
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.rbegin(),itEnd=localVariables.rend();it!=itEnd;++it){
					if((*it).localName==localName){
						dStack.setTop((*it).localAddress);
						return;
					}
				}		
			} 
			find();drop();toBody();
			
		}